

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::PrintTo<std::tuple<>,std::tuple<>>
               (pair<std::tuple<>,_std::tuple<>_> *value,ostream *os)

{
  char local_1a [2];
  
  local_1a[0] = '(';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  local_1a[1] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a + 1,1);
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}